

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

Error * ot::commissioner::coap::Message::Deserialize
                  (Error *__return_storage_ptr__,Header *aHeader,ByteArray *aBuf,size_t *aOffset)

{
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  ulong uVar4;
  char *pcVar5;
  byte bVar6;
  ulong uVar7;
  byte bVar8;
  char *pcVar9;
  char *pcVar10;
  pointer puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar13;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  writer write;
  string local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  writer local_a0;
  ErrorCode local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined8 local_70;
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  paVar12 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar12;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar4 = *aOffset;
  puVar11 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar11;
  local_a8 = paVar12;
  if (uVar4 < uVar7) {
    if (uVar4 + 1 < uVar7) {
      if (uVar4 + 3 < uVar7) {
        bVar1 = puVar11[uVar4];
        uVar2 = puVar11[uVar4 + 1];
        uVar3 = *(ushort *)(puVar11 + uVar4 + 2);
        local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar4 + 4);
        if ((bVar1 & 0xf) != 0) {
          uVar4 = (long)local_a8->_M_local_buf + (ulong)(bVar1 & 0xf);
          if (uVar7 < uVar4) {
            local_68.types_[0] = none_type;
            pcVar9 = "premature end of CoAP message header";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "premature end of CoAP message header";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
            local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
            local_68.parse_funcs_[0] = (parse_func)0x0;
            local_a8 = paVar12;
            local_a0.handler_ = &local_68;
            local_68.context_.types_ = local_68.types_;
            do {
              if (pcVar9 == "") break;
              pcVar10 = pcVar9;
              if (*pcVar9 == '{') {
LAB_001d30b7:
                fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                writer::operator()(&local_a0,pcVar9,pcVar10);
                pcVar9 = fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                   (pcVar10,"",&local_68);
                bVar13 = true;
              }
              else {
                pcVar10 = pcVar9 + 1;
                bVar13 = pcVar10 != "";
                if (bVar13) {
                  if (*pcVar10 != '{') {
                    pcVar5 = pcVar9 + 2;
                    do {
                      pcVar10 = pcVar5;
                      bVar13 = pcVar10 != "";
                      if (pcVar10 == "") goto LAB_001d30b3;
                      pcVar5 = pcVar10 + 1;
                    } while (*pcVar10 != '{');
                  }
                  bVar13 = true;
                }
LAB_001d30b3:
                if (bVar13) goto LAB_001d30b7;
                fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                writer::operator()(&local_a0,pcVar9,"");
                bVar13 = false;
              }
            } while (bVar13);
            args.field_1.values_ = in_R9.values_;
            args.desc_ = (unsigned_long_long)&local_68;
            fmt::v10::vformat_abi_cxx11_
                      (&local_c8,(v10 *)"premature end of CoAP message header",
                       (string_view)ZEXT816(0x24),args);
            local_98 = kBadFormat;
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,local_c8._M_dataplus._M_p,
                       local_c8._M_dataplus._M_p + local_c8._M_string_length);
            goto LAB_001d3436;
          }
          puVar11 = puVar11 + (long)local_a8;
          bVar8 = (byte)(bVar1 & 0xf);
          bVar6 = 8;
          if (bVar8 < 8) {
            bVar6 = bVar8;
          }
          local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)uVar4;
          memcpy(&local_70,puVar11,(ulong)bVar6);
        }
        *(byte *)aHeader = bVar1 >> 2 & 0xc | bVar1 >> 6 | bVar1 << 4;
        aHeader->mCode = uVar2;
        aHeader->mMessageId = uVar3 << 8 | uVar3 >> 8;
        *(undefined8 *)aHeader->mToken = local_70;
        *aOffset = (size_t)local_a8;
        return __return_storage_ptr__;
      }
      local_68.types_[0] = none_type;
      pcVar9 = "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      local_a0.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        if (pcVar9 == "") break;
        pcVar10 = pcVar9;
        if (*pcVar9 == '{') {
LAB_001d33b7:
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_a0,pcVar9,pcVar10);
          pcVar9 = fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar10,"",&local_68);
          bVar13 = true;
        }
        else {
          pcVar10 = pcVar9 + 1;
          bVar13 = pcVar10 != "";
          if (bVar13) {
            if (*pcVar10 != '{') {
              pcVar5 = pcVar9 + 2;
              do {
                pcVar10 = pcVar5;
                bVar13 = pcVar10 != "";
                if (pcVar10 == "") goto LAB_001d33b3;
                pcVar5 = pcVar10 + 1;
              } while (*pcVar10 != '{');
            }
            bVar13 = true;
          }
LAB_001d33b3:
          if (bVar13) goto LAB_001d33b7;
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_a0,pcVar9,"");
          bVar13 = false;
        }
      } while (bVar13);
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)&local_68;
      fmt::v10::vformat_abi_cxx11_
                (&local_c8,(v10 *)"premature end of CoAP message header",(string_view)ZEXT816(0x24),
                 args_02);
      local_98 = kBadFormat;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_c8._M_dataplus._M_p,
                 local_c8._M_dataplus._M_p + local_c8._M_string_length);
    }
    else {
      local_68.types_[0] = none_type;
      pcVar9 = "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      local_a0.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        if (pcVar9 == "") break;
        pcVar10 = pcVar9;
        if (*pcVar9 == '{') {
LAB_001d32b7:
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_a0,pcVar9,pcVar10);
          pcVar9 = fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar10,"",&local_68);
          bVar13 = true;
        }
        else {
          pcVar10 = pcVar9 + 1;
          bVar13 = pcVar10 != "";
          if (bVar13) {
            if (*pcVar10 != '{') {
              pcVar5 = pcVar9 + 2;
              do {
                pcVar10 = pcVar5;
                bVar13 = pcVar10 != "";
                if (pcVar10 == "") goto LAB_001d32b3;
                pcVar5 = pcVar10 + 1;
              } while (*pcVar10 != '{');
            }
            bVar13 = true;
          }
LAB_001d32b3:
          if (bVar13) goto LAB_001d32b7;
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_a0,pcVar9,"");
          bVar13 = false;
        }
      } while (bVar13);
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_68;
      fmt::v10::vformat_abi_cxx11_
                (&local_c8,(v10 *)"premature end of CoAP message header",(string_view)ZEXT816(0x24),
                 args_01);
      local_98 = kBadFormat;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_c8._M_dataplus._M_p,
                 local_c8._M_dataplus._M_p + local_c8._M_string_length);
    }
  }
  else {
    local_68.types_[0] = none_type;
    pcVar9 = "premature end of CoAP message header";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of CoAP message header";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_a0.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar9 == "") break;
      pcVar10 = pcVar9;
      if (*pcVar9 == '{') {
LAB_001d31b7:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_a0,pcVar9,pcVar10);
        pcVar9 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar10,"",&local_68);
        bVar13 = true;
      }
      else {
        pcVar10 = pcVar9 + 1;
        bVar13 = pcVar10 != "";
        if (bVar13) {
          if (*pcVar10 != '{') {
            pcVar5 = pcVar9 + 2;
            do {
              pcVar10 = pcVar5;
              bVar13 = pcVar10 != "";
              if (pcVar10 == "") goto LAB_001d31b3;
              pcVar5 = pcVar10 + 1;
            } while (*pcVar10 != '{');
          }
          bVar13 = true;
        }
LAB_001d31b3:
        if (bVar13) goto LAB_001d31b7;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_a0,pcVar9,"");
        bVar13 = false;
      }
    } while (bVar13);
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_c8,(v10 *)"premature end of CoAP message header",(string_view)ZEXT816(0x24),
               args_00);
    local_98 = kBadFormat;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_c8._M_dataplus._M_p,
               local_c8._M_dataplus._M_p + local_c8._M_string_length);
  }
LAB_001d3436:
  __return_storage_ptr__->mCode = local_98;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_90);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Deserialize(Header &aHeader, const ByteArray &aBuf, size_t &aOffset)
{
    Error  error;
    Header header;
    size_t offset = aOffset;

    VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mVersion     = aBuf[offset] >> 6;
    header.mType        = aBuf[offset] >> 4;
    header.mTokenLength = aBuf[offset++];

    VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mCode = aBuf[offset++];

    VerifyOrExit(offset + 1 < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mMessageId = aBuf[offset++];
    header.mMessageId = (header.mMessageId << 8) | aBuf[offset++];

    if (header.mTokenLength != 0)
    {
        VerifyOrExit(offset + header.mTokenLength <= aBuf.size(),
                     error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
        memcpy(header.mToken, &aBuf[offset], std::min(header.mTokenLength, kMaxTokenLength));
        offset += header.mTokenLength;
    }

    aHeader = header;
    aOffset = offset;

exit:
    return error;
}